

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

void __thiscall
duckdb::RowGroupCollection::CommitDropColumn(RowGroupCollection *this,idx_t column_index)

{
  RowGroupSegmentTree *this_00;
  RowGroup *this_01;
  ColumnData *pCVar1;
  RowGroup *row_group;
  
  this_00 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  for (this_01 = SegmentTree<duckdb::RowGroup,_true>::GetRootSegment
                           (&this_00->super_SegmentTree<duckdb::RowGroup,_true>);
      this_01 != (RowGroup *)0x0;
      this_01 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                          (&this_00->super_SegmentTree<duckdb::RowGroup,_true>,this_01)) {
    pCVar1 = RowGroup::GetColumn(this_01,column_index);
    (*pCVar1->_vptr_ColumnData[0x1a])(pCVar1);
  }
  return;
}

Assistant:

void RowGroupCollection::CommitDropColumn(const idx_t column_index) {
	for (auto &row_group : row_groups->Segments()) {
		row_group.CommitDropColumn(column_index);
	}
}